

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::StreamingListener::UrlEncode_abi_cxx11_(char *str)

{
  int iVar1;
  char *in_RSI;
  string *in_RDI;
  char ch;
  string *result;
  uchar in_stack_0000015f;
  undefined4 in_stack_ffffffffffffff80;
  string *__lhs;
  string local_68 [32];
  string local_48 [35];
  char local_25;
  undefined1 local_11;
  char *local_10;
  
  local_11 = 0;
  __lhs = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  strlen(local_10);
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_25 = *local_10;
  while (local_25 != '\0') {
    iVar1 = (int)local_25;
    if (((iVar1 == 10) || (iVar1 - 0x25U < 2)) || (iVar1 == 0x3d)) {
      String::FormatByte_abi_cxx11_(in_stack_0000015f);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar1,in_stack_ffffffffffffff80));
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_68);
    }
    else {
      std::__cxx11::string::push_back((char)in_RDI);
    }
    local_25 = local_10[1];
    local_10 = local_10 + 1;
  }
  return __lhs;
}

Assistant:

string StreamingListener::UrlEncode(const char* str) {
  string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.append("%" + String::FormatByte(static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}